

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu.cpp
# Opt level: O0

int __thiscall ncnn::ELU::forward_inplace(ELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  double dVar3;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  int local_90;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  Mat local_80;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x38);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    ncnn::Mat::channel(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_80);
    ncnn::Mat::~Mat((Mat *)0x38dd80);
    local_38 = pfVar2;
    for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
      if (local_38[local_90] <= 0.0 && local_38[local_90] != 0.0) {
        fVar1 = *(float *)(in_RDI + 0xd0);
        dVar3 = std::exp((double)(ulong)(uint)local_38[local_90]);
        local_38[local_90] = fVar1 * (SUB84(dVar3,0) - 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int ELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = static_cast<float>(alpha * (exp(ptr[i]) - 1.f));
        }
    }

    return 0;
}